

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O1

bool __thiscall
chrono::ChFunction_Sequence::InsertFunct
          (ChFunction_Sequence *this,shared_ptr<chrono::ChFunction> *myfx,double duration,
          double weight,bool c0,bool c1,bool c2,int position)

{
  size_t *psVar1;
  list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> *this_00;
  long lVar2;
  _Node *p_Var3;
  _List_node_base *p_Var4;
  bool bVar5;
  ChFseqNode mfxsegment;
  shared_ptr<chrono::ChFunction> local_90;
  double local_80;
  ChFseqNode local_78;
  
  local_90.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (myfx->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_90.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (myfx->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_90.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_90.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_90.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_90.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_90.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_80 = weight;
  ChFseqNode::ChFseqNode(&local_78,&local_90,duration);
  if (local_90.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_78.weight = local_80;
  bVar5 = position == -1;
  local_78.y_cont = c0;
  local_78.ydt_cont = c1;
  local_78.ydtdt_cont = c2;
  if (bVar5) {
    p_Var3 = std::__cxx11::list<chrono::ChFseqNode,std::allocator<chrono::ChFseqNode>>::
             _M_create_node<chrono::ChFseqNode_const&>
                       ((list<chrono::ChFseqNode,std::allocator<chrono::ChFseqNode>> *)
                        &this->functions,&local_78);
    std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
    psVar1 = &(this->functions).
              super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    this_00 = &this->functions;
    p_Var4 = (this->functions).
             super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    if (p_Var4 != (_List_node_base *)this_00) {
      lVar2 = (long)position + 1;
      do {
        lVar2 = lVar2 + -1;
        if (lVar2 == 0) {
          p_Var3 = std::__cxx11::list<chrono::ChFseqNode,std::allocator<chrono::ChFseqNode>>::
                   _M_create_node<chrono::ChFseqNode_const&>
                             ((list<chrono::ChFseqNode,std::allocator<chrono::ChFseqNode>> *)this_00
                              ,&local_78);
          std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
          psVar1 = &(this->functions).
                    super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>.
                    _M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          bVar5 = true;
          break;
        }
        p_Var4 = p_Var4->_M_next;
      } while (p_Var4 != (_List_node_base *)this_00);
    }
  }
  if (bVar5 == false) {
    p_Var3 = std::__cxx11::list<chrono::ChFseqNode,std::allocator<chrono::ChFseqNode>>::
             _M_create_node<chrono::ChFseqNode_const&>
                       ((list<chrono::ChFseqNode,std::allocator<chrono::ChFseqNode>> *)
                        &this->functions,&local_78);
    std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
    psVar1 = &(this->functions).
              super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  Setup(this);
  if (local_78.fx.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.fx.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return bVar5;
}

Assistant:

bool ChFunction_Sequence::InsertFunct(std::shared_ptr<ChFunction> myfx,
                                      double duration,
                                      double weight,
                                      bool c0,
                                      bool c1,
                                      bool c2,
                                      int position) {
    ChFseqNode mfxsegment(myfx, duration);
    mfxsegment.y_cont = c0;
    mfxsegment.ydt_cont = c1;
    mfxsegment.ydtdt_cont = c2;
    mfxsegment.weight = weight;

    bool inserted = false;

    if (position == -1) {
        functions.push_back(mfxsegment);
        inserted = true;
    }
    if (!inserted) {
        std::list<ChFseqNode>::iterator iter;
        size_t i = 0;
        for (iter = functions.begin(); iter != functions.end(); ++iter, ++i) {
            if (i == position) {
                functions.insert(iter, mfxsegment);
                inserted = true;
                break;
            }
        }
    }
    if (!inserted) {
        functions.push_back(mfxsegment);
    }
    // update the continuity offsets and timings
    this->Setup();
    return inserted;
}